

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void change_direction_move(Direction *direction,char input_direction)

{
  Direction DVar1;
  ulong uVar2;
  int iVar3;
  undefined7 in_register_00000031;
  
  iVar3 = (int)CONCAT71(in_register_00000031,input_direction);
  DVar1 = LEFT;
  if (iVar3 < 0x61) {
    switch(iVar3) {
    case 0x41:
switchD_00103c54_caseD_41:
      *direction = UP;
      uVar2 = (ulong)((int)input_direction - 0x42U);
      if (0x31 < (int)input_direction - 0x42U) {
        return;
      }
      if ((0x80000004UL >> (uVar2 & 0x3f) & 1) != 0) goto switchD_00103c54_caseD_44;
      if ((0x400000002U >> (uVar2 & 0x3f) & 1) == 0) {
        if ((0x2000000000001U >> (uVar2 & 0x3f) & 1) == 0) {
          return;
        }
        goto switchD_00103c54_caseD_42;
      }
      break;
    case 0x42:
switchD_00103c54_caseD_42:
      *direction = DOWN;
      if (input_direction < 'a') {
        if (input_direction != 'C') {
          if (input_direction != 'D') {
switchD_00103c54_default:
            return;
          }
          goto switchD_00103c54_caseD_44;
        }
      }
      else {
        if (input_direction == 'a') goto switchD_00103c54_caseD_44;
        if (input_direction != 'd') {
          return;
        }
      }
      break;
    case 0x43:
      break;
    case 0x44:
      goto switchD_00103c54_caseD_44;
    default:
      goto switchD_00103c54_default;
    }
  }
  else {
    if (0x72 < iVar3) {
      if (iVar3 != 0x73) {
        if (iVar3 != 0x77) {
          return;
        }
        goto switchD_00103c54_caseD_41;
      }
      goto switchD_00103c54_caseD_42;
    }
    if (iVar3 == 0x61) goto switchD_00103c54_caseD_44;
    if (iVar3 != 100) {
      return;
    }
  }
  DVar1 = RIGHT;
switchD_00103c54_caseD_44:
  *direction = DVar1;
  return;
}

Assistant:

void change_direction_move(Direction& direction, char input_direction)
{
    if(input_direction == KEY_UP or input_direction == 'w')
        direction = UP;

    if(input_direction == KEY_DOWN or input_direction == 's')
        direction = DOWN;

    if(input_direction == KEY_LEFT or input_direction == 'a')
        direction = LEFT;

    if(input_direction == KEY_RIGHT or input_direction == 'd')
        direction = RIGHT;
}